

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_functional.h
# Opt level: O0

Context __thiscall
mp::QuadraticFunctionalConstraint::
AddQuadraticConstraint<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
          (QuadraticFunctionalConstraint *this,
          FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          *cvt)

{
  bool bVar1;
  QuadraticExpr *pQVar2;
  undefined8 uVar3;
  QuadTerms *in_RSI;
  QuadraticFunctionalConstraint *in_RDI;
  double dVar4;
  NodeRange NVar5;
  QuadTerms qt;
  LinTerms le;
  QuadTerms *in_stack_ffffffffffffed38;
  NodeIndexRange in_stack_ffffffffffffed40;
  ValueNode *in_stack_ffffffffffffed48;
  QuadTerms *in_stack_ffffffffffffed50;
  LinTerms *in_stack_ffffffffffffed58;
  undefined1 uVar6;
  LinTerms *lt;
  QuadAndLinTerms *in_stack_ffffffffffffed60;
  QuadAndLinTerms *this_00;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *in_stack_ffffffffffffed68;
  AlgConRhs<_1> in_stack_ffffffffffffed70;
  undefined8 in_stack_ffffffffffffed80;
  int c;
  Error *in_stack_ffffffffffffed88;
  CStringRef in_stack_ffffffffffffed90;
  BasicCStringRef<char> local_1238;
  NodeRange local_1230;
  AlgConRhs<_1> local_1220;
  undefined1 local_1218 [1364];
  Context local_cc4;
  NodeRange local_cc0;
  AlgConRhs<1> local_cb0 [171];
  Context local_754;
  NodeRange local_750;
  AlgConRhs<0> local_740 [171];
  Context local_1e4 [115];
  QuadTerms *local_18;
  CtxVal local_4;
  
  c = (int)((ulong)in_stack_ffffffffffffed80 >> 0x20);
  local_18 = in_RSI;
  pQVar2 = GetQuadExpr(in_RDI);
  QuadAndLinTerms::GetLinTerms(&pQVar2->super_QuadAndLinTerms);
  LinTerms::LinTerms((LinTerms *)in_stack_ffffffffffffed50,(LinTerms *)in_stack_ffffffffffffed48);
  FunctionalConstraint::GetResultVar(&in_RDI->super_FunctionalConstraint);
  LinTerms::add_term((LinTerms *)in_stack_ffffffffffffed50,(double)in_stack_ffffffffffffed48,
                     in_stack_ffffffffffffed40.end_);
  pQVar2 = GetQuadExpr(in_RDI);
  QuadAndLinTerms::GetQPTerms(&pQVar2->super_QuadAndLinTerms);
  QuadTerms::QuadTerms
            ((QuadTerms *)in_stack_ffffffffffffed70.rhs_,(QuadTerms *)in_stack_ffffffffffffed68);
  local_1e4[0] = FunctionalConstraint::GetContext(&in_RDI->super_FunctionalConstraint);
  bVar1 = Context::IsMixed(local_1e4);
  if (bVar1) {
    LinTerms::LinTerms((LinTerms *)in_stack_ffffffffffffed40,(LinTerms *)in_stack_ffffffffffffed38);
    QuadTerms::QuadTerms((QuadTerms *)in_stack_ffffffffffffed40,in_stack_ffffffffffffed38);
    QuadAndLinTerms::QuadAndLinTerms
              (in_stack_ffffffffffffed60,in_stack_ffffffffffffed58,in_stack_ffffffffffffed50);
    uVar6 = (undefined1)((ulong)in_stack_ffffffffffffed58 >> 0x38);
    pQVar2 = GetQuadExpr(in_RDI);
    dVar4 = AlgebraicExpression<mp::QuadAndLinTerms>::constant_term(pQVar2);
    AlgConRhs<0>::AlgConRhs(local_740,-dVar4);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
              ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *)
               in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
               (AlgConRhs<0>)in_stack_ffffffffffffed70.rhs_,(bool)uVar6);
    local_750 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
                ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>
                          ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                            *)in_stack_ffffffffffffed70.rhs_,
                           (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *)
                           in_stack_ffffffffffffed68);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint
              ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *)
               in_stack_ffffffffffffed40);
    QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_ffffffffffffed40);
    QuadTerms::~QuadTerms((QuadTerms *)in_stack_ffffffffffffed40);
    LinTerms::~LinTerms((LinTerms *)in_stack_ffffffffffffed40);
    NVar5.ir_ = in_stack_ffffffffffffed40;
    NVar5.pvn_ = in_stack_ffffffffffffed48;
  }
  else {
    local_754 = FunctionalConstraint::GetContext(&in_RDI->super_FunctionalConstraint);
    bVar1 = Context::HasPositive(&local_754);
    if (bVar1) {
      LinTerms::LinTerms((LinTerms *)in_stack_ffffffffffffed40,(LinTerms *)in_stack_ffffffffffffed38
                        );
      QuadTerms::QuadTerms((QuadTerms *)in_stack_ffffffffffffed40,in_stack_ffffffffffffed38);
      QuadAndLinTerms::QuadAndLinTerms
                (in_stack_ffffffffffffed60,in_stack_ffffffffffffed58,in_stack_ffffffffffffed50);
      uVar6 = (undefined1)((ulong)in_stack_ffffffffffffed58 >> 0x38);
      pQVar2 = GetQuadExpr(in_RDI);
      dVar4 = AlgebraicExpression<mp::QuadAndLinTerms>::constant_term(pQVar2);
      AlgConRhs<1>::AlgConRhs(local_cb0,-dVar4);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
                ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *)
                 in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
                 (AlgConRhs<1>)in_stack_ffffffffffffed70.rhs_,(bool)uVar6);
      local_cc0 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
                  ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>>
                            ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                              *)in_stack_ffffffffffffed70.rhs_,
                             (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *)
                             in_stack_ffffffffffffed68);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
                ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *)
                 in_stack_ffffffffffffed40);
      QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_ffffffffffffed40);
      QuadTerms::~QuadTerms((QuadTerms *)in_stack_ffffffffffffed40);
      LinTerms::~LinTerms((LinTerms *)in_stack_ffffffffffffed40);
      NVar5.ir_ = in_stack_ffffffffffffed40;
      NVar5.pvn_ = in_stack_ffffffffffffed48;
    }
    else {
      local_cc4 = FunctionalConstraint::GetContext(&in_RDI->super_FunctionalConstraint);
      bVar1 = Context::HasNegative(&local_cc4);
      if (!bVar1) {
        uVar3 = __cxa_allocate_exception(0x18);
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_1238,"QuadraticFuncCon: no context");
        Error::Error(in_stack_ffffffffffffed88,in_stack_ffffffffffffed90,c);
        __cxa_throw(uVar3,&Error::typeinfo,Error::~Error);
      }
      lt = (LinTerms *)(local_1218 + 0x140);
      LinTerms::LinTerms((LinTerms *)in_stack_ffffffffffffed40,(LinTerms *)in_stack_ffffffffffffed38
                        );
      this_00 = (QuadAndLinTerms *)local_1218;
      QuadTerms::QuadTerms((QuadTerms *)in_stack_ffffffffffffed40,in_stack_ffffffffffffed38);
      QuadAndLinTerms::QuadAndLinTerms(this_00,lt,local_18);
      uVar6 = (undefined1)((ulong)lt >> 0x38);
      pQVar2 = GetQuadExpr(in_RDI);
      dVar4 = AlgebraicExpression<mp::QuadAndLinTerms>::constant_term(pQVar2);
      AlgConRhs<-1>::AlgConRhs(&local_1220,-dVar4);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                (in_stack_ffffffffffffed68,this_00,in_stack_ffffffffffffed70,(bool)uVar6);
      NVar5 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
              ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
                        ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          *)in_stack_ffffffffffffed70.rhs_,in_stack_ffffffffffffed68);
      local_1230 = NVar5;
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
                ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)NVar5.ir_);
      QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)NVar5.ir_);
      QuadTerms::~QuadTerms((QuadTerms *)NVar5.ir_);
      LinTerms::~LinTerms((LinTerms *)NVar5.ir_);
    }
  }
  local_4 = (CtxVal)FunctionalConstraint::GetContext(&in_RDI->super_FunctionalConstraint);
  QuadTerms::~QuadTerms((QuadTerms *)NVar5.ir_);
  LinTerms::~LinTerms((LinTerms *)NVar5.ir_);
  return (Context)local_4;
}

Assistant:

Context AddQuadraticConstraint(Converter& cvt) const {
    auto le = GetQuadExpr().GetLinTerms();
    le.add_term(-1.0, FunctionalConstraint::GetResultVar());
    auto qt = GetQuadExpr().GetQPTerms();
    if (GetContext().IsMixed())
      cvt.AddConstraint( QuadConEQ{ { std::move(le), std::move(qt) },
      -GetQuadExpr().constant_term() } );
    else if (GetContext().HasPositive())
      cvt.AddConstraint( QuadConGE{ { std::move(le), std::move(qt) },
      -GetQuadExpr().constant_term() } );
    else if (GetContext().HasNegative())
      cvt.AddConstraint( QuadConLE{ { std::move(le), std::move(qt) },
      -GetQuadExpr().constant_term() } );
    else
      MP_RAISE("QuadraticFuncCon: no context");
    return GetContext();
  }